

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::DeepTiledInputFile::Data::TileBufferTask::~TileBufferTask(TileBufferTask *this)

{
  atomic<Imf_3_4::(anonymous_namespace)::TileProcess_*> *paVar1;
  TileProcess *pTVar2;
  TileProcessGroup *pTVar3;
  TileProcess *pTVar4;
  TileProcess *pTVar5;
  bool bVar6;
  
  pTVar2 = this->_tile;
  pTVar3 = this->_tile_group;
  pTVar5 = (pTVar3->_avail_head)._M_b._M_p;
  do {
    pTVar2->next = pTVar5;
    paVar1 = &pTVar3->_avail_head;
    LOCK();
    pTVar4 = (paVar1->_M_b)._M_p;
    bVar6 = pTVar5 == pTVar4;
    if (bVar6) {
      (paVar1->_M_b)._M_p = pTVar2;
      pTVar4 = pTVar5;
    }
    UNLOCK();
    pTVar5 = pTVar4;
  } while (!bVar6);
  IlmThread_3_4::Semaphore::post();
  IlmThread_3_4::Task::~Task(&this->super_Task);
  return;
}

Assistant:

~TileBufferTask () override
        {
            _tile_group->push (_tile);
        }